

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaForce.c
# Opt level: O1

int Frc_ManCrossCut2_rec(Frc_Man_t *p,Frc_Obj_t *pObj)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  
  uVar1 = pObj->iFanout;
  if (uVar1 != 0) {
    pObj->iFanout = uVar1 - 1;
    if (uVar1 == pObj->nFanouts) {
      iVar3 = p->nCutCur + 1;
      p->nCutCur = iVar3;
      if (iVar3 < p->nCutMax) {
        iVar3 = p->nCutMax;
      }
      p->nCutMax = iVar3;
      uVar1 = *(uint *)pObj;
      if (0xf < uVar1 && (uVar1 & 1) == 0) {
        uVar4 = (ulong)(uVar1 >> 4);
        do {
          iVar3 = Frc_ManCrossCut2_rec
                            (p,(Frc_Obj_t *)
                               ((long)pObj + (long)(int)(&pObj->field_9)[uVar4].iFanin * -4));
          p->nCutCur = p->nCutCur - iVar3;
          bVar2 = 1 < (long)uVar4;
          uVar4 = uVar4 - 1;
        } while (bVar2);
      }
    }
    return (int)(pObj->iFanout == 0);
  }
  __assert_fail("pObj->iFanout > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaForce.c"
                ,0x279,"int Frc_ManCrossCut2_rec(Frc_Man_t *, Frc_Obj_t *)");
}

Assistant:

int Frc_ManCrossCut2_rec( Frc_Man_t * p, Frc_Obj_t * pObj )
{
    assert( pObj->iFanout > 0 );
    if ( pObj->iFanout-- == pObj->nFanouts )
    {
        Frc_Obj_t * pFanin;
        int i;
        p->nCutCur++;
        p->nCutMax = Abc_MaxInt( p->nCutMax, p->nCutCur );
        if ( !Frc_ObjIsCi(pObj) )
            Frc_ObjForEachFaninReverse( pObj, pFanin, i )
                p->nCutCur -= Frc_ManCrossCut2_rec( p, pFanin );
    }
    return pObj->iFanout == 0;
}